

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O1

double duckdb::alp::AlpRDCompression<double,_true>::BuildLeftPartsDictionary<true>
                 (vector<unsigned_long,_true> *values,uint8_t right_bit_width,State *state)

{
  uint16_t uVar1;
  ulong *puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer pAVar5;
  pointer pAVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  reference pvVar9;
  uint uVar10;
  unsigned_long *value;
  ulong *puVar11;
  __node_base _Var12;
  long lVar13;
  long lVar14;
  undefined7 in_register_00000031;
  size_type __n;
  __hashtable *__h_1;
  __hashtable *__h;
  size_type sVar15;
  double dVar16;
  undefined1 auVar17 [16];
  unsigned_long left_tmp;
  vector<duckdb::alp::AlpRDLeftPartInfo,_true> left_parts_sorted_repetitions;
  unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  left_parts_hash;
  undefined8 local_b0;
  vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_> local_a8;
  uint local_8c;
  double local_88;
  undefined4 local_7c;
  double local_78;
  vector<unsigned_long,_true> *local_70;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_a8.
  super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar11 = (values->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar2 = (values->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_7c = (undefined4)CONCAT71(in_register_00000031,right_bit_width);
  local_88 = (double)(ulong)right_bit_width;
  local_70 = values;
  if (puVar11 != puVar2) {
    do {
      local_b0 = *puVar11 >> (SUB81(local_88,0) & 0x3f);
      pmVar7 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,&local_b0);
      *pmVar7 = *pmVar7 + 1;
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar2);
  }
  ::std::vector<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>::
  reserve(&local_a8,local_68._M_element_count);
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var12._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      ::std::vector<duckdb::alp::AlpRDLeftPartInfo,std::allocator<duckdb::alp::AlpRDLeftPartInfo>>::
      emplace_back<int&,unsigned_long_const&>
                ((vector<duckdb::alp::AlpRDLeftPartInfo,std::allocator<duckdb::alp::AlpRDLeftPartInfo>>
                  *)&local_a8,(int *)(_Var12._M_nxt + 2),(unsigned_long *)(_Var12._M_nxt + 1));
      _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt;
    } while (_Var12._M_nxt != (_Hash_node_base *)0x0);
  }
  pAVar6 = local_a8.
           super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar5 = local_a8.
           super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_a8.
      super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar8 = (long)local_a8.
                  super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_a8.
                  super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar13 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::alp::AlpRDLeftPartInfo*,std::vector<duckdb::alp::AlpRDLeftPartInfo,std::allocator<duckdb::alp::AlpRDLeftPartInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::alp::AlpRDCompression<double,true>::BuildLeftPartsDictionary<true>(duckdb::vector<unsigned_long,true>const&,unsigned_char,duckdb::alp::AlpRDCompressionState<double,true>&)::_lambda(duckdb::alp::AlpRDLeftPartInfo_const&,duckdb::alp::AlpRDLeftPartInfo_const&)_1_>>
              (local_a8.
               super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_a8.
               super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<duckdb::alp::AlpRDLeftPartInfo*,std::vector<duckdb::alp::AlpRDLeftPartInfo,std::allocator<duckdb::alp::AlpRDLeftPartInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::alp::AlpRDCompression<double,true>::BuildLeftPartsDictionary<true>(duckdb::vector<unsigned_long,true>const&,unsigned_char,duckdb::alp::AlpRDCompressionState<double,true>&)::_lambda(duckdb::alp::AlpRDLeftPartInfo_const&,duckdb::alp::AlpRDLeftPartInfo_const&)_1_>>
              (pAVar5,pAVar6);
  }
  uVar8 = (long)local_a8.
                super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_a8.
                super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_78 = 0.0;
  if (8 < uVar8) {
    sVar15 = 8;
    uVar10 = 0;
    do {
      pvVar9 = vector<duckdb::alp::AlpRDLeftPartInfo,_true>::operator[]
                         ((vector<duckdb::alp::AlpRDLeftPartInfo,_true> *)&local_a8,sVar15);
      uVar10 = uVar10 + pvVar9->count;
      sVar15 = sVar15 + 1;
      uVar8 = (long)local_a8.
                    super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8.
                    super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
    } while (sVar15 < uVar8);
    local_78 = (double)((uVar10 & 0xffff) << 5);
  }
  sVar15 = 8;
  if (uVar8 < 8) {
    sVar15 = uVar8;
  }
  dVar16 = log2((double)(long)sVar15);
  dVar16 = ceil(dVar16);
  local_8c = 1;
  if (1 < (byte)(int)dVar16) {
    local_8c = (int)dVar16;
  }
  if (uVar8 != 0) {
    __n = 0;
    do {
      pvVar9 = vector<duckdb::alp::AlpRDLeftPartInfo,_true>::operator[]
                         ((vector<duckdb::alp::AlpRDLeftPartInfo,_true> *)&local_a8,__n);
      uVar1 = (uint16_t)pvVar9->hash;
      state->left_parts_dict[__n] = uVar1;
      local_b0._0_4_ = CONCAT22((short)__n,uVar1);
      ::std::
      _Hashtable<unsigned_short,std::pair<unsigned_short_const,unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_short_const,unsigned_short>>
                ((_Hashtable<unsigned_short,std::pair<unsigned_short_const,unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&state->left_parts_dict_map,&local_b0);
      __n = __n + 1;
    } while (sVar15 != __n);
  }
  uVar8 = sVar15 + 1;
  if (uVar8 < (ulong)((long)local_a8.
                            super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_a8.
                            super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    do {
      pvVar9 = vector<duckdb::alp::AlpRDLeftPartInfo,_true>::operator[]
                         ((vector<duckdb::alp::AlpRDLeftPartInfo,_true> *)&local_a8,uVar8);
      local_b0._0_4_ = CONCAT22((short)uVar8,(short)pvVar9->hash);
      ::std::
      _Hashtable<unsigned_short,std::pair<unsigned_short_const,unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_short_const,unsigned_short>>
                ((_Hashtable<unsigned_short,std::pair<unsigned_short_const,unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&state->left_parts_dict_map,&local_b0);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)local_a8.
                                   super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_a8.
                                   super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  state->left_bit_width = (uint8_t)local_8c;
  state->right_bit_width = (uint8_t)local_7c;
  state->actual_dictionary_size = (uint8_t)sVar15;
  puVar3 = (local_70->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (local_70->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_a8.
      super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<duckdb::alp::AlpRDLeftPartInfo,_std::allocator<duckdb::alp::AlpRDLeftPartInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  lVar13 = (long)puVar4 - (long)puVar3;
  lVar14 = lVar13 >> 3;
  auVar17._8_4_ = (int)(lVar13 >> 0x23);
  auVar17._0_8_ = lVar14;
  auVar17._12_4_ = 0x45300000;
  local_88 = (double)(int)((local_8c & 0xff) + local_88._0_4_) +
             local_78 /
             ((auVar17._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0));
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return local_88;
}

Assistant:

static double BuildLeftPartsDictionary(const vector<EXACT_TYPE> &values, uint8_t right_bit_width, State &state) {
		unordered_map<EXACT_TYPE, int32_t> left_parts_hash;
		vector<AlpRDLeftPartInfo> left_parts_sorted_repetitions;

		// Building a hash for all the left parts and how many times they appear
		for (auto &value : values) {
			auto left_tmp = value >> right_bit_width;
			left_parts_hash[left_tmp]++;
		}

		// We build a vector from the hash to be able to sort it by repetition count
		left_parts_sorted_repetitions.reserve(left_parts_hash.size());
		for (auto &hash_pair : left_parts_hash) {
			left_parts_sorted_repetitions.emplace_back(hash_pair.second, hash_pair.first);
		}
		sort(left_parts_sorted_repetitions.begin(), left_parts_sorted_repetitions.end(),
		     [](const AlpRDLeftPartInfo &a, const AlpRDLeftPartInfo &b) { return a.count > b.count; });

		// Exceptions are left parts which do not fit in the fixed dictionary size
		uint32_t exceptions_count = 0;
		for (idx_t i = AlpRDConstants::MAX_DICTIONARY_SIZE; i < left_parts_sorted_repetitions.size(); i++) {
			exceptions_count += left_parts_sorted_repetitions[i].count;
		}

		// The left parts bit width after compression is determined by how many elements are in the dictionary
		uint64_t actual_dictionary_size =
		    MinValue<uint64_t>(AlpRDConstants::MAX_DICTIONARY_SIZE, left_parts_sorted_repetitions.size());
		uint8_t left_bit_width =
		    MaxValue<uint8_t>(1, ExactNumericCast<uint8_t>(std::ceil(std::log2(actual_dictionary_size))));

		if (PERSIST_DICT) {
			for (idx_t dict_idx = 0; dict_idx < actual_dictionary_size; dict_idx++) {
				//! The dict keys are mapped to the left part themselves
				state.left_parts_dict[dict_idx] =
				    UnsafeNumericCast<uint16_t>(left_parts_sorted_repetitions[dict_idx].hash);
				state.left_parts_dict_map.insert({state.left_parts_dict[dict_idx], dict_idx});
			}
			//! Pararelly we store a map of the dictionary to quickly resolve exceptions during encoding
			for (idx_t i = actual_dictionary_size + 1; i < left_parts_sorted_repetitions.size(); i++) {
				state.left_parts_dict_map.insert({left_parts_sorted_repetitions[i].hash, i});
			}
			state.left_bit_width = left_bit_width;
			state.right_bit_width = right_bit_width;
			state.actual_dictionary_size = UnsafeNumericCast<uint8_t>(actual_dictionary_size);

			D_ASSERT(state.left_bit_width > 0 && state.right_bit_width > 0 &&
			         state.left_bit_width <= AlpRDConstants::MAX_DICTIONARY_BIT_WIDTH &&
			         state.actual_dictionary_size <= AlpRDConstants::MAX_DICTIONARY_SIZE);
		}

		double estimated_size = EstimateCompressionSize(right_bit_width, left_bit_width,
		                                                UnsafeNumericCast<uint16_t>(exceptions_count), values.size());
		return estimated_size;
	}